

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O3

void randomx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  type tVar3;
  type tVar4;
  bool bVar5;
  uint cycle;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer pMVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 *this;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  RegisterInfo *registers_00;
  SuperscalarInstruction currentInstruction;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  int local_964;
  int local_954;
  int local_950;
  int local_94c;
  uint local_938;
  int local_934;
  SuperscalarInstruction local_928;
  pointer local_8f8;
  ulong local_8f0;
  ulong local_8e8;
  SuperscalarInstructionInfo *local_8e0;
  RegisterInfo local_8d8 [8];
  type local_858 [522];
  
  lVar17 = 0;
  memset(local_858,0,0x828);
  do {
    *(undefined8 *)((long)&local_8d8[0].latency + lVar17) = 0xffffffff00000000;
    *(undefined8 *)((long)&local_8d8[0].lastOpPar + lVar17) = 0xffffffff;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x80);
  local_928._34_6_ = uRam000000000012ba22;
  local_928._32_2_ = DAT_0012ba20;
  local_928.mod_ = _DAT_0012ba10;
  local_928.imm32_ = DAT_0012ba10_4;
  local_928.opGroup_ = (SuperscalarInstructionType)uRam000000000012ba18;
  local_928.opGroupPar_ = uRam000000000012ba18._4_4_;
  local_928.info_ = SuperscalarInstruction::Null;
  local_928.src_ = (int)DAT_0012ba08;
  local_928.dst_ = DAT_0012ba08._4_4_;
  uVar12 = 0;
  this = DecoderBuffer::Default;
  registers_00 = local_8d8;
  local_954 = 0;
  local_934 = 0;
  uVar8 = 0;
  uVar7 = 0;
  local_964 = 0;
  local_8e8 = 0;
  local_950 = 0;
  uVar11 = 0;
  bVar16 = false;
  local_938 = 0;
  do {
    this = (undefined1 *)
           DecoderBuffer::fetchNext
                     ((DecoderBuffer *)this,(local_928.info_)->type_,(int)local_8e8,local_950,gen);
    iVar14 = ((DecoderBuffer *)this)->opsCount_;
    if (0 < iVar14) {
      local_94c = 0;
      do {
        pMVar9 = ((local_928.info_)->ops_).
                 super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)((local_928.info_)->ops_).
                                super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) >> 5) <=
            (int)uVar12) {
          if ((bVar16) || (0x1ff < (int)uVar11)) break;
          SuperscalarInstruction::createForSlot
                    (&local_928,gen,((DecoderBuffer *)this)->counts_[local_94c],
                     ((DecoderBuffer *)this)->index_,iVar14 == local_94c + 1,local_94c == 0);
          pMVar9 = ((local_928.info_)->ops_).
                   super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = 0;
        }
        iVar14 = (int)uVar12;
        local_8f8 = pMVar9 + iVar14;
        uVar10 = uVar7;
        if ((int)uVar7 < (int)uVar8) {
          uVar10 = uVar8;
        }
        if (pMVar9[iVar14].dependent_ == false) {
          uVar10 = uVar8;
        }
        tVar3 = pMVar9[iVar14].uop1_;
        local_8f0 = uVar12;
        local_8e0 = local_928.info_;
        if (tVar3 != 0) {
          tVar4 = local_8f8->uop2_;
          if (tVar4 == 0) {
            uVar10 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,uVar10);
            goto LAB_00114004;
          }
          if ((int)uVar10 < 0xae) {
            while( true ) {
              cycle = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,uVar10);
              uVar6 = scheduleUop<false>(tVar4,(type (*) [174] [3])local_858,uVar10);
              if ((-1 < (int)cycle) && (cycle == uVar6)) break;
              uVar10 = uVar10 + 1;
              if (uVar10 == 0xae) goto LAB_0011434f;
            }
            goto LAB_00114010;
          }
LAB_0011434f:
          uVar10 = (int)local_8e8 + 1;
          goto LAB_00114362;
        }
LAB_00114004:
        cycle = uVar10;
        if ((int)uVar10 < 0) goto LAB_0011434f;
LAB_00114010:
        uVar12 = local_8f0;
        iVar14 = (int)local_8f0;
        uVar10 = uVar8;
        if (iVar14 == local_8e0->srcOp_) {
          iVar15 = 0;
          do {
            bVar5 = SuperscalarInstruction::selectSource(&local_928,cycle,&registers_00,gen);
            if (bVar5) {
              uVar10 = uVar8 - iVar15;
              goto LAB_0011407f;
            }
            cycle = cycle + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != -4);
joined_r0x001140c5:
          uVar8 = uVar10 + 4;
          if (0xff < local_964) {
            local_928._32_2_ = DAT_0012ba20;
            local_928.info_ = SuperscalarInstruction::Null;
            local_928._8_8_ = DAT_0012ba08;
            local_928._16_8_ = _DAT_0012ba10;
            local_928._24_8_ = uRam000000000012ba18;
            break;
          }
          local_964 = local_964 + 1;
          uVar12 = (ulong)((long)((local_928.info_)->ops_).
                                 super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)((local_928.info_)->ops_).
                                super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
        }
        else {
LAB_0011407f:
          uVar6 = cycle;
          if (iVar14 == (local_928.info_)->dstOp_) {
            iVar14 = 0;
            do {
              bVar5 = SuperscalarInstruction::selectDestination
                                (&local_928,cycle + iVar14,0 < local_964,&registers_00,gen);
              uVar6 = cycle + iVar14;
              if (bVar5) goto LAB_0011410a;
              iVar14 = iVar14 + 1;
              uVar12 = local_8f0;
            } while (iVar14 != 4);
            goto joined_r0x001140c5;
          }
LAB_0011410a:
          tVar3 = local_8f8->uop1_;
          if (tVar3 == 0) {
LAB_00114185:
            if ((int)uVar6 < 0) goto LAB_0011434f;
          }
          else {
            tVar4 = local_8f8->uop2_;
            if (tVar4 == 0) {
              uVar6 = scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,uVar6);
              goto LAB_00114185;
            }
            if (0xad < (int)uVar6) goto LAB_0011434f;
            while( true ) {
              uVar7 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,uVar6);
              uVar10 = scheduleUop<false>(tVar4,(type (*) [174] [3])local_858,uVar6);
              if ((-1 < (int)uVar7) && (uVar7 == uVar10)) break;
              uVar6 = uVar6 + 1;
              if (uVar6 == 0xae) goto LAB_0011434f;
            }
            scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,uVar7);
            scheduleUop<true>(local_8f8->uop2_,(type (*) [174] [3])local_858,uVar7);
            uVar6 = uVar7;
          }
          uVar7 = local_8f8->latency_ + uVar6;
          if ((int)local_8f0 == (local_928.info_)->resultOp_) {
            local_8d8[local_928.dst_].latency = uVar7;
            local_8d8[local_928.dst_].lastOpGroup = local_928.opGroup_;
            local_8d8[local_928.dst_].lastOpPar = local_928.opGroupPar_;
            local_938 = uVar7;
          }
          local_954 = local_954 + local_8f8->size_;
          local_94c = local_94c + 1;
          uVar10 = (int)local_8f0 + 1;
          uVar12 = (ulong)uVar10;
          local_934 = local_934 + 1;
          if (0xa9 < uVar6) {
            bVar16 = true;
          }
          local_964 = 0;
          if ((int)((ulong)((long)((local_928.info_)->ops_).
                                  super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_928.info_)->ops_).
                                 super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar10) {
            prog->programBuffer[(int)uVar11].opcode = (char)(local_928.info_)->type_;
            prog->programBuffer[(int)uVar11].dst = (uint8_t)local_928.dst_;
            iVar14 = local_928.src_;
            if (local_928.src_ < 0) {
              iVar14 = local_928.dst_;
            }
            prog->programBuffer[(int)uVar11].src = (uint8_t)iVar14;
            prog->programBuffer[(int)uVar11].mod = (uint8_t)local_928.mod_;
            prog->programBuffer[(int)uVar11].imm32 = local_928.imm32_;
            if ((0xd < (uint)(local_928.info_)->type_) ||
               (iVar14 = 1, (0x3808U >> ((local_928.info_)->type_ & 0x1f) & 1) == 0)) {
              iVar14 = 0;
            }
            uVar11 = uVar11 + 1;
            local_950 = local_950 + iVar14;
          }
        }
        iVar14 = ((DecoderBuffer *)this)->opsCount_;
      } while (local_94c < iVar14);
    }
    uVar10 = (uint)local_8e8 + 1;
    if ((0xa8 < (uint)local_8e8) || (bVar16)) break;
    uVar8 = uVar8 + 1;
    local_8e8 = (ulong)uVar10;
  } while ((int)uVar11 < 0x200);
LAB_00114362:
  prog->asicLatencies[4] = 0;
  prog->asicLatencies[5] = 0;
  prog->asicLatencies[6] = 0;
  prog->asicLatencies[7] = 0;
  prog->asicLatencies[0] = 0;
  prog->asicLatencies[1] = 0;
  prog->asicLatencies[2] = 0;
  prog->asicLatencies[3] = 0;
  if (0 < (int)uVar11) {
    uVar12 = 0;
    do {
      bVar1 = prog->programBuffer[uVar12].dst;
      bVar2 = prog->programBuffer[uVar12].src;
      iVar14 = 0;
      if (bVar1 != bVar2) {
        iVar14 = prog->asicLatencies[bVar2] + 1;
      }
      iVar15 = prog->asicLatencies[bVar1] + 1;
      if (iVar15 <= iVar14) {
        iVar15 = iVar14;
      }
      prog->asicLatencies[bVar1] = iVar15;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  uVar13 = 0;
  uVar12 = 0;
  iVar14 = 0;
  do {
    if (iVar14 < prog->asicLatencies[uVar13]) {
      uVar12 = uVar13 & 0xffffffff;
      iVar14 = prog->asicLatencies[uVar13];
    }
    prog->cpuLatencies[uVar13] = ((RegisterInfo *)&registers_00->latency)->latency;
    uVar13 = uVar13 + 1;
    registers_00 = registers_00 + 1;
  } while (uVar13 != 8);
  prog->size = uVar11;
  prog->addrReg = (int)uVar12;
  prog->cpuLatency = local_938;
  prog->asicLatency = iVar14;
  prog->codeSize = local_954;
  prog->macroOps = local_934;
  prog->decodeCycles = uVar10;
  prog->ipc = (double)local_934 / (double)(int)local_938;
  prog->mulCount = local_950;
  return;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current RandomX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << scheduleCycle << ")" << std::endl;
					portsSaturated = true;
					break;
				}

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}